

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

sqlite3_int64 sqlite3_soft_heap_limit64(sqlite3_int64 n)

{
  int iVar1;
  sqlite3_int64 sVar2;
  bool local_39;
  int rc;
  sqlite3_int64 nUsed;
  sqlite3_int64 excess;
  sqlite3_int64 priorLimit;
  sqlite3_int64 n_local;
  
  iVar1 = sqlite3_initialize();
  if (iVar1 == 0) {
    sqlite3_mutex_enter(mem0.mutex);
    n_local = mem0.alarmThreshold;
    if (n < 0) {
      sqlite3_mutex_leave(mem0.mutex);
    }
    else {
      priorLimit = n;
      if ((0 < mem0.hardLimit) && ((mem0.hardLimit < n || (n == 0)))) {
        priorLimit = mem0.hardLimit;
      }
      mem0.alarmThreshold = priorLimit;
      sVar2 = sqlite3StatusValue(0);
      local_39 = 0 < priorLimit && priorLimit <= sVar2;
      mem0.nearlyFull = (int)local_39;
      sqlite3_mutex_leave(mem0.mutex);
      sVar2 = sqlite3_memory_used();
      if (0 < sVar2 - priorLimit) {
        sqlite3_release_memory((uint)(sVar2 - priorLimit) & 0x7fffffff);
      }
    }
  }
  else {
    n_local = -1;
  }
  return n_local;
}

Assistant:

SQLITE_API sqlite3_int64 sqlite3_soft_heap_limit64(sqlite3_int64 n){
  sqlite3_int64 priorLimit;
  sqlite3_int64 excess;
  sqlite3_int64 nUsed;
#ifndef SQLITE_OMIT_AUTOINIT
  int rc = sqlite3_initialize();
  if( rc ) return -1;
#endif
  sqlite3_mutex_enter(mem0.mutex);
  priorLimit = mem0.alarmThreshold;
  if( n<0 ){
    sqlite3_mutex_leave(mem0.mutex);
    return priorLimit;
  }
  if( mem0.hardLimit>0 && (n>mem0.hardLimit || n==0) ){
    n = mem0.hardLimit;
  }
  mem0.alarmThreshold = n;
  nUsed = sqlite3StatusValue(SQLITE_STATUS_MEMORY_USED);
  AtomicStore(&mem0.nearlyFull, n>0 && n<=nUsed);
  sqlite3_mutex_leave(mem0.mutex);
  excess = sqlite3_memory_used() - n;
  if( excess>0 ) sqlite3_release_memory((int)(excess & 0x7fffffff));
  return priorLimit;
}